

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O1

bool __thiscall cmCTestGIT::DiffParser::ProcessLine(DiffParser *this)

{
  string *this_00;
  char cVar1;
  char cVar2;
  int iVar3;
  DiffFieldType DVar4;
  char *pcVar5;
  char *pcVar6;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  if (*(this->super_LineParser).Line._M_dataplus._M_p == ':') {
    this->DiffField = DiffFieldChange;
    local_40 = 0;
    local_38 = 0;
    (this->CurChange).Action = '?';
    local_48 = &local_38;
    std::__cxx11::string::operator=((string *)&(this->CurChange).Path,(string *)&local_48);
    if (local_48 != &local_38) {
      operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
    }
  }
  DVar4 = this->DiffField;
  if (DVar4 == DiffFieldDst) {
LAB_002d5789:
    std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
    std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
              (&this->Changes,&this->CurChange);
    DVar4 = DiffFieldNone;
  }
  else {
    if (DVar4 != DiffFieldSrc) {
      if (DVar4 != DiffFieldChange) {
        return true;
      }
      pcVar6 = (this->super_LineParser).Line._M_dataplus._M_p;
      DVar4 = DiffFieldNone;
      if (*pcVar6 == ':') {
        do {
          pcVar5 = pcVar6 + 1;
          pcVar6 = pcVar6 + 1;
          if (*pcVar5 == '\0') break;
          iVar3 = isspace((int)*pcVar5);
        } while (iVar3 == 0);
        cVar2 = *pcVar6;
        while ((cVar2 != '\0' && (iVar3 = isspace((int)cVar2), iVar3 != 0))) {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        cVar2 = *pcVar6;
        while ((cVar2 != '\0' && (iVar3 = isspace((int)cVar2), iVar3 == 0))) {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        cVar2 = *pcVar6;
        while ((cVar2 != '\0' && (iVar3 = isspace((int)cVar2), iVar3 != 0))) {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        cVar2 = *pcVar6;
        while ((cVar2 != '\0' && (iVar3 = isspace((int)cVar2), iVar3 == 0))) {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        cVar2 = *pcVar6;
        while ((cVar2 != '\0' && (iVar3 = isspace((int)cVar2), iVar3 != 0))) {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        cVar2 = *pcVar6;
        while ((cVar2 != '\0' && (iVar3 = isspace((int)cVar2), iVar3 == 0))) {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        cVar2 = *pcVar6;
        while ((cVar2 != '\0' && (iVar3 = isspace((int)cVar2), iVar3 != 0))) {
          cVar2 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        }
        cVar2 = *pcVar6;
        cVar1 = cVar2;
        pcVar5 = pcVar6;
        while ((cVar1 != '\0' && (iVar3 = isspace((int)cVar1), iVar3 == 0))) {
          cVar1 = pcVar5[1];
          pcVar5 = pcVar5 + 1;
        }
        if (pcVar6 != pcVar5) {
          (this->CurChange).Action = cVar2;
          DVar4 = DiffFieldSrc;
        }
      }
      goto LAB_002d58e7;
    }
    cVar2 = (this->CurChange).Action;
    if (cVar2 == 'R') {
      (this->CurChange).Action = 'D';
      this_00 = &(this->CurChange).Path;
      std::__cxx11::string::_M_assign((string *)this_00);
      std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::push_back
                (&this->Changes,&this->CurChange);
      local_40 = 0;
      local_38 = 0;
      (this->CurChange).Action = 'A';
      local_48 = &local_38;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_48);
      if (local_48 != &local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
    }
    else {
      if (cVar2 != 'C') goto LAB_002d5789;
      (this->CurChange).Action = 'A';
    }
    DVar4 = DiffFieldDst;
  }
LAB_002d58e7:
  this->DiffField = DVar4;
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->Line[0] == ':')
      {
      this->DiffField = DiffFieldChange;
      this->CurChange = Change();
      }
    if(this->DiffField == DiffFieldChange)
      {
      // :src-mode dst-mode src-sha1 dst-sha1 status
      if(this->Line[0] != ':')
        {
        this->DiffField = DiffFieldNone;
        return true;
        }
      const char* src_mode_first = this->Line.c_str()+1;
      const char* src_mode_last  = this->ConsumeField(src_mode_first);
      const char* dst_mode_first = this->ConsumeSpace(src_mode_last);
      const char* dst_mode_last  = this->ConsumeField(dst_mode_first);
      const char* src_sha1_first = this->ConsumeSpace(dst_mode_last);
      const char* src_sha1_last  = this->ConsumeField(src_sha1_first);
      const char* dst_sha1_first = this->ConsumeSpace(src_sha1_last);
      const char* dst_sha1_last  = this->ConsumeField(dst_sha1_first);
      const char* status_first   = this->ConsumeSpace(dst_sha1_last);
      const char* status_last    = this->ConsumeField(status_first);
      if(status_first != status_last)
        {
        this->CurChange.Action = *status_first;
        this->DiffField = DiffFieldSrc;
        }
      else
        {
        this->DiffField = DiffFieldNone;
        }
      }
    else if(this->DiffField == DiffFieldSrc)
      {
      // src-path
      if(this->CurChange.Action == 'C')
        {
        // Convert copy to addition of destination.
        this->CurChange.Action = 'A';
        this->DiffField = DiffFieldDst;
        }
      else if(this->CurChange.Action == 'R')
        {
        // Convert rename to deletion of source and addition of destination.
        this->CurChange.Action = 'D';
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);

        this->CurChange = Change('A');
        this->DiffField = DiffFieldDst;
        }
      else
        {
        this->CurChange.Path = this->Line;
        this->Changes.push_back(this->CurChange);
        this->DiffField = this->DiffFieldNone;
        }
      }
    else if(this->DiffField == DiffFieldDst)
      {
      // dst-path
      this->CurChange.Path = this->Line;
      this->Changes.push_back(this->CurChange);
      this->DiffField = this->DiffFieldNone;
      }
    return true;
    }